

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

float rsg::VariableWrite::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  VariableManager *pVVar1;
  bool bVar2;
  pointer ppVVar3;
  IsWritableSupersetEntry local_38;
  
  bVar2 = rsg::anon_unknown_0::canAllocateVariable(state,valueRange.m_type);
  if (!bVar2) {
    pVVar1 = state->m_varManager;
    local_38.m_valueRange.m_max = valueRange.m_max;
    local_38.m_valueRange.m_type = valueRange.m_type;
    local_38.m_valueRange.m_min = valueRange.m_min;
    ppVVar3 = (pVVar1->m_entryCache).
              super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      if (ppVVar3 ==
          (pVVar1->m_entryCache).
          super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        return 0.0;
      }
      bVar2 = rsg::anon_unknown_0::IsWritableSupersetEntry::operator()(&local_38,*ppVVar3);
      ppVVar3 = ppVVar3 + 1;
    } while (!bVar2);
  }
  return 1.0;
}

Assistant:

float VariableWrite::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (!canAllocateVariable(state, valueRange.getType()) &&
		!state.getVariableManager().hasEntry(IsWritableSupersetEntry(valueRange)))
		return 0.0f;
	else
		return 1.0f;
}